

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.cpp
# Opt level: O1

void __thiscall ThreadPool::Run(ThreadPool *this,CallFunc *func)

{
  _Map_pointer ppfVar1;
  undefined8 uVar2;
  LockGuard lock;
  LockGuard local_20;
  
  if (this->m_bRunning != false) {
    LockGuard::LockGuard(&local_20,&this->m_mutex);
    while (ppfVar1 = (this->m_tasks).
                     super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node,
          (ulong)(long)this->m_maxTaskNum <=
          ((long)(this->m_tasks).
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(this->m_tasks).
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
          ((long)(this->m_tasks).
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)(this->m_tasks).
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
          ((((ulong)((long)ppfVar1 -
                    (long)(this->m_tasks).
                          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(ppfVar1 == (_Map_pointer)0x0)) * 0x10) {
      Condition::Wait(&this->m_notFull);
    }
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
              (&this->m_tasks,func);
    Condition::Notify(&this->m_notEmpty);
    LockGuard::~LockGuard(&local_20);
    return;
  }
  if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*func->_M_invoker)((_Any_data *)func);
    return;
  }
  uVar2 = std::__throw_bad_function_call();
  LockGuard::~LockGuard(&local_20);
  _Unwind_Resume(uVar2);
}

Assistant:

void ThreadPool::Run(CallFunc func)
{
	if (!m_bRunning)
	{
		func();
	}
	else
	{
		LockGuard lock(m_mutex);
		while(m_tasks.size() >= m_maxTaskNum)
		{
			m_notFull.Wait();
		}
		
		m_tasks.push_back(func);
		m_notEmpty.Notify();
	}
}